

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

double getParaDescent(DoublePerlinNoise *para,double factor,int x,int z,int w,int h,int i0,int j0,
                     int maxrad,int maxiter,double alpha,void *data,
                     _func_int_void_ptr_int_int_double *func)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar10 = sampleDoublePerlin(para,(double)(i0 + x),0.0,(double)(j0 + z));
  dVar10 = dVar10 * factor;
  if ((func != (_func_int_void_ptr_int_int_double *)0x0) &&
     (iVar1 = (*func)(data,i0 + x,j0 + z,
                      (double)(~-(ulong)(factor < 0.0) & (ulong)dVar10 |
                              (ulong)-dVar10 & -(ulong)(factor < 0.0))), iVar1 != 0)) {
LAB_00116599:
    dVar10 = nan("");
    return dVar10;
  }
  if (maxiter < 1) {
    return dVar10;
  }
  iVar7 = 0;
  uVar6 = 0;
  uVar9 = 0;
  iVar1 = j0;
  iVar4 = i0;
  do {
    uVar9 = uVar9 + (uVar9 == 0);
    dVar11 = dVar10;
    if ((int)(iVar4 + uVar9) < w && -1 < (int)(iVar4 + uVar9)) {
      dVar11 = sampleDoublePerlin(para,(double)(int)(x + uVar9 + iVar4),0.0,(double)(iVar1 + z));
      dVar11 = dVar11 * factor;
    }
    if (dVar10 <= dVar11) {
      dVar11 = dVar10;
      if ((int)(iVar4 - uVar9) < w && -1 < (int)(iVar4 - uVar9)) {
        dVar11 = sampleDoublePerlin(para,(double)(int)((x - uVar9) + iVar4),0.0,(double)(iVar1 + z))
        ;
        dVar11 = dVar11 * factor;
      }
      if (dVar10 <= dVar11) {
        uVar9 = 0;
      }
      else {
        uVar9 = -uVar9;
      }
    }
    if (uVar9 != 0) {
      uVar2 = (uint)((dVar10 - dVar11) * (double)(int)uVar9 * alpha);
      uVar8 = -uVar2;
      if (0 < (int)uVar2) {
        uVar8 = uVar2;
      }
      if ((uVar8 < 3) || (iVar5 = iVar4 + uVar2, w <= iVar5 || iVar5 < 0)) {
LAB_00116756:
        iVar5 = iVar4 + uVar9;
        dVar10 = dVar11;
      }
      else {
        dVar12 = sampleDoublePerlin(para,(double)(int)(uVar2 + x + iVar4),0.0,(double)(iVar1 + z));
        dVar10 = dVar12 * factor;
        if (dVar11 <= dVar12 * factor) goto LAB_00116756;
      }
      iVar4 = iVar5;
      if ((func != (_func_int_void_ptr_int_int_double *)0x0) &&
         (iVar5 = (*func)(data,iVar5 + x,iVar1 + z,
                          (double)(~-(ulong)(factor < 0.0) & (ulong)dVar10 |
                                  (ulong)-dVar10 & -(ulong)(factor < 0.0))), iVar5 != 0))
      goto LAB_00116599;
    }
    uVar6 = uVar6 + (uVar6 == 0);
    dVar11 = dVar10;
    if ((int)(iVar1 + uVar6) < h && -1 < (int)(iVar1 + uVar6)) {
      dVar11 = sampleDoublePerlin(para,(double)(x + iVar4),0.0,(double)(int)(uVar6 + z + iVar1));
      dVar11 = dVar11 * factor;
    }
    if (dVar10 <= dVar11) {
      dVar11 = dVar10;
      if ((int)(iVar1 - uVar6) < h && -1 < (int)(iVar1 - uVar6)) {
        dVar11 = sampleDoublePerlin(para,(double)(x + iVar4),0.0,(double)(int)((z - uVar6) + iVar1))
        ;
        dVar11 = dVar11 * factor;
      }
      if (dVar10 <= dVar11) {
        uVar6 = 0;
      }
      else {
        uVar6 = -uVar6;
      }
    }
    if (uVar6 != 0) {
      uVar2 = (uint)((dVar10 - dVar11) * (double)(int)uVar6 * alpha);
      uVar8 = -uVar2;
      if (0 < (int)uVar2) {
        uVar8 = uVar2;
      }
      if ((uVar8 < 3) || (iVar5 = iVar1 + uVar2, h <= iVar5 || iVar5 < 0)) {
LAB_0011693c:
        iVar5 = iVar1 + uVar6;
        dVar10 = dVar11;
      }
      else {
        dVar12 = sampleDoublePerlin(para,(double)(x + iVar4),0.0,(double)(int)(uVar2 + iVar1 + z));
        dVar10 = dVar12 * factor;
        if (dVar11 <= dVar12 * factor) goto LAB_0011693c;
      }
      iVar1 = iVar5;
      if ((func != (_func_int_void_ptr_int_int_double *)0x0) &&
         (iVar5 = (*func)(data,iVar4 + x,z + iVar5,
                          (double)(~-(ulong)(factor < 0.0) & (ulong)dVar10 |
                                  (ulong)-dVar10 & -(ulong)(factor < 0.0))), iVar5 != 0))
      goto LAB_00116599;
    }
    if (uVar6 == 0 && uVar9 == 0) {
      uVar8 = 0;
      do {
        uVar9 = -(uVar8 & 1) | 1;
        uVar6 = (uVar8 < 2) - 1 | 1;
        iVar5 = uVar9 + iVar4;
        if ((iVar5 < w && -1 < iVar5) && (iVar3 = uVar6 + iVar1, iVar3 < h && -1 < iVar3)) {
          dVar11 = sampleDoublePerlin(para,(double)(int)(x + iVar4 + uVar9),0.0,
                                      (double)(int)(z + iVar1 + uVar6));
          dVar11 = dVar11 * factor;
          if (dVar11 < dVar10) goto LAB_00116a9d;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 4);
      uVar8 = 4;
      dVar11 = dVar10;
      iVar3 = iVar1;
      iVar5 = iVar4;
LAB_00116a9d:
      iVar4 = iVar5;
      dVar10 = dVar11;
      iVar1 = iVar3;
      if (3 < uVar8) {
        return dVar11;
      }
    }
    iVar3 = iVar4 - i0;
    iVar5 = -iVar3;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
    if (maxrad < iVar5) {
      return dVar10;
    }
    iVar3 = iVar1 - j0;
    iVar5 = -iVar3;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
    if (maxrad < iVar5) {
      return dVar10;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == maxiter) {
      return dVar10;
    }
  } while( true );
}

Assistant:

double getParaDescent(const DoublePerlinNoise *para, double factor,
    int x, int z, int w, int h, int i0, int j0, int maxrad,
    int maxiter, double alpha, void *data, int (*func)(void*,int,int,double))
{
    /// Do a gradient descent on a grid...
    /// To start with, we will just consider a step size of 1 in one axis:
    ///   Try going in positive x: if gradient is upwards go to negative x
    ///   then do the same with z - if all 4 directions go upwards then we have
    ///   found a minimum, otherwise repeat.
    /// We can remember and try the direction from the previous cycle first to
    /// reduce the number of wrong guesses.
    ///
    /// We can also use a larger step size than 1, as long as we believe that
    /// the minimum is not in between. To determine if this is viable, we check
    /// the step size of 1 first, and then jump if the gradient appears large
    /// enough in that direction.
    ///
    ///TODO:
    /// The perlin noise can be sampled continuously, so more established
    /// minima algorithms can also be considered...

    int dirx = 0, dirz = 0, dira;
    int k, i, j;
    double v, vd, va;
    v = factor * sampleDoublePerlin(para, x+i0, 0, z+j0);
    if (func)
    {
        if (func(data, x+i0, z+j0, factor < 0 ? -v : v))
            return nan("");
    }

    i = i0; j = j0;
    for (k = 0; k < maxiter; k++)
    {
        if (dirx == 0) dirx = +1;
        if (i+dirx >= 0 && i+dirx < w)
            vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j);
        else vd = v;
        if (vd >= v)
        {
            dirx *= -1;
            if (i+dirx >= 0 && i+dirx < w)
                vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j);
            else vd = v;
            if (vd >= v)
                dirx = 0;
        }
        if (dirx)
        {
            dira = (int)(dirx * alpha * (v - vd));
            if (abs(dira) > 2 && i+dira >= 0 && i+dira < w)
            {   // try jumping by more than 1
                va = factor * sampleDoublePerlin(para, x+i+dira, 0, z+j);
                if (va < vd)
                {
                    i += dira;
                    v = va;
                    goto L_x_end;
                }
            }
            v = vd;
            i += dirx;
        L_x_end:
            if (func)
            {
                if (func(data, x+i, z+j, factor < 0 ? -v : v))
                    return nan("");
            }
        }

        if (dirz == 0) dirz = +1;
        if (j+dirz >= 0 && j+dirz < h)
            vd = factor * sampleDoublePerlin(para, x+i, 0, z+j+dirz);
        else vd = v;
        if (vd >= v)
        {
            dirz *= -1;
            if (j+dirz >= 0 && j+dirz < h)
                vd = factor * sampleDoublePerlin(para, x+i, 0, z+j+dirz);
            else vd = v;
            if (vd >= v)
                dirz = 0;
        }
        if (dirz)
        {
            dira = (int)(dirz * alpha * (v - vd));
            if (abs(dira) > 2 && j+dira >= 0 && j+dira < h)
            {   // try jumping by more than 1
                va = factor * sampleDoublePerlin(para, x+i, 0, z+j+dira);
                if (va < vd)
                {
                    j += dira;
                    v = va;
                    goto L_z_end;
                }
            }
            j += dirz;
            v = vd;
        L_z_end:
            if (func)
            {
                if (func(data, x+i, z+j, factor < 0 ? -v : v))
                    return nan("");
            }
        }
        if (dirx == 0 && dirz == 0)
        {   // this is very likely a fix point
            // but there could be a minimum along a diagonal path in rare cases
            int c;
            for (c = 0; c < 4; c++)
            {
                dirx = (c & 1) ? -1 : +1;
                dirz = (c & 2) ? -1 : +1;
                if (i+dirx < 0 || i+dirx >= w || j+dirz < 0 || j+dirz >= h)
                    continue;
                vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j+dirz);
                if (vd < v)
                {
                    v = vd;
                    i += dirx;
                    j += dirz;
                    break;
                }
            }
            if (c >= 4)
                break;
        }
        if (abs(i - i0) > maxrad || abs(j - j0) > maxrad)
            break; // we have gone too far from the origin
    }

    return v;
}